

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O1

void __thiscall compiler::EmissionContext::PopScope(EmissionContext *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer puVar2;
  pointer puVar3;
  undefined8 uVar4;
  long lVar5;
  string local_48;
  
  puVar2 = (this->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &local_48.field_2;
  local_48._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"PopScope called with empty scopeStartIndex","");
  Error::assertWithPanic(puVar2 != puVar3,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  puVar2 = (this->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar3 = (this->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  lVar5 = (long)puVar3 - (long)puVar2 >> 3;
  if (puVar3 != puVar2) {
    this->firstFreeVariablesIndex = puVar2[lVar5 + -1];
    (this->scopeStartIndex).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_finish = puVar3 + -1;
    return;
  }
  uVar4 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     lVar5 + -1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != paVar1) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar4);
}

Assistant:

void PopScope() {
    Error::assertWithPanic(!this->scopeStartIndex.empty(), "PopScope called with empty scopeStartIndex");

    this->firstFreeVariablesIndex = this->scopeStartIndex.at(this->scopeStartIndex.size() - 1);
    this->scopeStartIndex.pop_back();
  }